

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlSerializeText(xmlOutputBufferPtr buf,xmlChar *string,uint flags)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  xmlChar *utf;
  uint uVar6;
  int len;
  char tempBuf [12];
  int local_40;
  char local_3c [12];
  
  if (string == (xmlChar *)0x0) {
    return;
  }
  pcVar5 = "";
  if ((flags & 1) == 0) {
    pcVar5 = "";
  }
LAB_001701d3:
  if (*string == '\0') {
    return;
  }
  uVar6 = 0xffffffff;
  iVar3 = 0;
  utf = string;
  do {
    uVar1 = *utf;
    if ((long)(char)uVar1 < 0) {
      if ((flags & 2) != 0) break;
    }
    else {
      uVar6 = (uint)pcVar5[(char)uVar1];
      if (-1 < pcVar5[(char)uVar1]) break;
    }
    utf = utf + 1;
    iVar3 = iVar3 + 1;
  } while( true );
  if (string < utf) {
    xmlOutputBufferWrite(buf,iVar3,(char *)string);
  }
  if ((int)uVar6 < 0) {
    local_40 = 4;
    iVar3 = xmlGetUTF8Char(utf,&local_40);
    if (iVar3 < 0) {
      iVar3 = 0xfffd;
      lVar4 = 1;
    }
    else {
      if (iVar3 < 0x100) {
        if (iVar3 < 0x20) {
          if (4 < iVar3 - 9U) goto LAB_001702c2;
          iVar3 = *(int *)(&DAT_001db7d4 + (ulong)(iVar3 - 9U) * 4);
        }
      }
      else if ((0xfffff < iVar3 - 0x10000U && 0x1ffd < iVar3 - 0xe000U) && 0xd7ff < iVar3) {
LAB_001702c2:
        iVar3 = 0xfffd;
      }
      lVar4 = (long)local_40;
    }
    string = utf + lVar4;
    iVar3 = xmlSerializeHexCharRef(local_3c,iVar3);
    xmlOutputBufferWrite(buf,iVar3,local_3c);
  }
  else {
    if (uVar1 == '\0') {
      bVar2 = false;
      string = utf;
      goto LAB_001702ed;
    }
    xmlOutputBufferWrite
              (buf,(int)"\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;"
                        [uVar6],
               "\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;" +
               (ulong)uVar6 + 1);
    string = utf + 1;
  }
  bVar2 = true;
LAB_001702ed:
  if (!bVar2) {
    return;
  }
  goto LAB_001701d3;
}

Assistant:

static void
xmlSerializeText(xmlOutputBufferPtr buf, const xmlChar *string,
                 unsigned flags) {
    const char *cur;
    const signed char *tab;

    if (string == NULL)
        return;

    if (flags & XML_ESCAPE_ATTR)
        tab = xmlEscapeTabAttr;
    else
        tab = xmlEscapeTab;

    cur = (const char *) string;

    while (*cur != 0) {
        const char *base;
        int c;
        int offset;

        base = cur;
        offset = -1;

        while (1) {
            c = (unsigned char) *cur;

            if (c < 0x80) {
                offset = tab[c];
                if (offset >= 0)
                    break;
            } else if (flags & XML_ESCAPE_NON_ASCII) {
                break;
            }

            cur += 1;
        }

        if (cur > base)
            xmlOutputBufferWrite(buf, cur - base, base);

        if (offset >= 0) {
            if (c == 0)
                break;

            xmlOutputBufferWrite(buf, xmlEscapeContent[offset],
                                 &xmlEscapeContent[offset+1]);
            cur += 1;
        } else {
            char tempBuf[12];
            int tempSize;
            int val = 0, len = 4;

            val = xmlGetUTF8Char((const xmlChar *) cur, &len);
            if (val < 0) {
                val = 0xFFFD;
                cur += 1;
            } else {
                if (!IS_CHAR(val))
                    val = 0xFFFD;
                cur += len;
            }

            tempSize = xmlSerializeHexCharRef(tempBuf, val);
            xmlOutputBufferWrite(buf, tempSize, tempBuf);
        }
    }
}